

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# elfio_section.hpp
# Opt level: O2

void __thiscall
ELFIO::section_impl<ELFIO::Elf32_Shdr>::~section_impl(section_impl<ELFIO::Elf32_Shdr> *this)

{
  (this->super_section)._vptr_section = (_func_int **)&PTR__section_impl_00127528;
  if (this->data != (char *)0x0) {
    operator_delete__(this->data);
  }
  std::__cxx11::string::~string((string *)&this->name);
  return;
}

Assistant:

~section_impl()
    {
        delete [] data;
    }